

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWAP.cpp
# Opt level: O1

void __thiscall
qclab::qgates::SWAP<std::complex<double>_>::apply
          (SWAP<std::complex<double>_> *this,Side side,Op op,int nbQubits,
          SquareMatrix<std::complex<double>_> *matrix,int offset)

{
  char *__assertion;
  int target;
  int control;
  CNOT<std::complex<double>_> cnot10;
  CNOT<std::complex<double>_> cnot01;
  CX<std::complex<double>_> local_60;
  CX<std::complex<double>_> local_48;
  
  if (nbQubits < 2) {
    __assert_fail("nbQubits >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/SWAP.cpp"
                  ,0x24,
                  "virtual void qclab::qgates::SWAP<std::complex<double>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<double>]"
                 );
  }
  if (matrix->size_ == (long)(1 << ((byte)nbQubits & 0x1f))) {
    control = (this->qubits_)._M_elems[0] + offset;
    if (control < nbQubits) {
      target = offset + (this->qubits_)._M_elems[1];
      if (target < nbQubits) {
        CX<std::complex<double>_>::CX(&local_48,control,target,1);
        CX<std::complex<double>_>::CX(&local_60,target,control,1);
        CX<std::complex<double>_>::apply(&local_48,side,op,nbQubits,matrix,0);
        CX<std::complex<double>_>::apply(&local_60,side,op,nbQubits,matrix,0);
        CX<std::complex<double>_>::apply(&local_48,side,op,nbQubits,matrix,0);
        local_60.super_QControlledGate2<std::complex<double>_>.super_QGate2<std::complex<double>_>.
        super_QObject<std::complex<double>_>._vptr_QObject =
             (QObject<std::complex<double>_>)&PTR_nbQubits_00520170;
        if (local_60.gate_._M_t.
            super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
            .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>.
            _M_head_impl !=
            (__uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
             )0x0) {
          (*(((QGate1<std::complex<double>_> *)
             local_60.gate_._M_t.
             super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
             .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>.
             _M_head_impl)->super_QObject<std::complex<double>_>)._vptr_QObject[0xd])();
        }
        local_48.super_QControlledGate2<std::complex<double>_>.super_QGate2<std::complex<double>_>.
        super_QObject<std::complex<double>_>._vptr_QObject =
             (QObject<std::complex<double>_>)&PTR_nbQubits_00520170;
        if ((tuple<qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
             )local_48.gate_._M_t.
              super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
              .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>.
              _M_head_impl !=
            (_Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>)0x0) {
          (**(code **)(*(long *)local_48.gate_._M_t.
                                super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
                                .
                                super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>
                                ._M_head_impl + 0x68))();
        }
        return;
      }
      __assertion = "qubit1 < nbQubits";
    }
    else {
      __assertion = "qubit0 < nbQubits";
    }
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/SWAP.cpp"
                  ,0x28,
                  "virtual void qclab::qgates::SWAP<std::complex<double>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<double>]"
                 );
  }
  __assert_fail("matrix.size() == 1 << nbQubits",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/SWAP.cpp"
                ,0x25,
                "virtual void qclab::qgates::SWAP<std::complex<double>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<double>]"
               );
}

Assistant:

void SWAP< T >::apply( Side side , Op op , const int nbQubits ,
                         qclab::dense::SquareMatrix< T >& matrix ,
                         const int offset ) const {
    assert( nbQubits >= 2 ) ;
    assert( matrix.size() == 1 << nbQubits ) ;
    const int qubit0 = qubits_[0] + offset ;
    const int qubit1 = qubits_[1] + offset ;
    assert( qubit0 < nbQubits ) ; assert( qubit1 < nbQubits ) ;
    // 3x CNOT
    qclab::qgates::CNOT< T > cnot01( qubit0 , qubit1 ) ;
    qclab::qgates::CNOT< T > cnot10( qubit1 , qubit0 ) ;
    cnot01.apply( side , op , nbQubits , matrix ) ;
    cnot10.apply( side , op , nbQubits , matrix ) ;
    cnot01.apply( side , op , nbQubits , matrix ) ;
  }